

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O3

void __thiscall QBalloonTip::balloon(QBalloonTip *this,QPoint *pos,int msecs,bool showArrow)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  QPalette *pQVar5;
  undefined8 *puVar6;
  long *plVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  long in_FS_OFFSET;
  double dVar17;
  QSize QVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  QColor QVar24;
  QPainter painter2;
  QPainter painter1;
  QPainterPath path;
  int local_d0;
  QBrush local_b8 [8];
  QPen local_b0 [8];
  undefined1 *local_a8 [2];
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  undefined1 *puStack_50;
  undefined1 *local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->showArrow = showArrow;
  lVar3 = QGuiApplication::screenAt(pos);
  if (lVar3 == 0) {
    QGuiApplication::primaryScreen();
  }
  auVar23 = QScreen::geometry();
  uVar4 = (**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  iVar8 = (int)uVar4 + (pos->xp).m_i + -0x12;
  iVar10 = (pos->yp).m_i + (int)((ulong)uVar4 >> 0x20) + 0x12;
  iVar15 = (auVar23._12_4_ - auVar23._4_4_) + 1;
  iVar12 = auVar23._8_4_;
  iVar16 = auVar23._0_4_;
  iVar1 = (iVar12 - iVar16) + 1;
  iVar11 = 0x15;
  iVar9 = 3;
  if (iVar10 < iVar15) {
    iVar9 = 0x15;
    iVar11 = 3;
  }
  uVar14 = 0x12;
  if (iVar15 <= iVar10) {
    uVar14 = 0;
  }
  QWidget::setContentsMargins(&this->super_QWidget,4,iVar9,4,iVar11);
  QWidget::updateGeometry(&this->super_QWidget);
  uVar4 = (**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  local_68._8_8_ = (**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  iVar13 = (-(uint)(iVar10 < iVar15) | 0xffffffed) + (int)((ulong)local_68._8_8_ >> 0x20);
  iVar9 = (int)local_68._8_8_;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)local_68);
  dVar17 = (double)uVar14;
  local_58._0_4_ = 0;
  local_58._4_4_ = 0x401c0000;
  puStack_50 = (undefined1 *)dVar17;
  QPainterPath::moveTo((QPointF *)local_68);
  iVar11 = (int)uVar4;
  if ((iVar15 <= iVar10) || (iVar1 <= iVar8)) {
    if (iVar10 < iVar15 && iVar1 <= iVar8) {
      if (showArrow) {
        local_58 = (undefined1  [8])(double)(iVar9 + -0x25);
        puStack_50 = (undefined1 *)dVar17;
        QPainterPath::lineTo((QPointF *)local_68);
        puStack_50 = (undefined1 *)(double)(int)(uVar14 - 0x12);
        local_58 = (undefined1  [8])(double)(iVar9 + -0x13);
        QPainterPath::lineTo((QPointF *)local_68);
        local_58 = (undefined1  [8])(double)(iVar9 + -0x13);
        puStack_50 = (undefined1 *)dVar17;
        QPainterPath::lineTo((QPointF *)local_68);
      }
      iVar2 = ((pos->xp).m_i - iVar11) + 0x12;
      local_58._0_4_ = (iVar12 - iVar11) + -2;
      if (iVar2 < (int)local_58._0_4_) {
        local_58._0_4_ = iVar2;
      }
      local_58._4_4_ = (pos->yp).m_i;
      goto LAB_0038965f;
    }
  }
  else {
    if (showArrow) {
      local_58._0_4_ = 0;
      local_58._4_4_ = 0x40320000;
      puStack_50 = (undefined1 *)dVar17;
      QPainterPath::lineTo((QPointF *)local_68);
      puStack_50 = (undefined1 *)(double)(int)(uVar14 - 0x12);
      local_58._0_4_ = 0;
      local_58._4_4_ = 0x40320000;
      QPainterPath::lineTo((QPointF *)local_68);
      local_58._0_4_ = 0;
      local_58._4_4_ = 0x40420000;
      puStack_50 = (undefined1 *)dVar17;
      QPainterPath::lineTo((QPointF *)local_68);
    }
    local_58._0_4_ = (pos->xp).m_i + -0x12;
    if ((int)local_58._0_4_ <= iVar16 + 2) {
      local_58._0_4_ = iVar16 + 2;
    }
    local_58._4_4_ = (pos->yp).m_i;
LAB_0038965f:
    QWidget::move(&this->super_QWidget,(QPoint *)local_58);
  }
  local_58 = (undefined1  [8])(double)(iVar9 + -8);
  puStack_50 = (undefined1 *)dVar17;
  QPainterPath::lineTo((QPointF *)local_68);
  QVar18 = (QSize)(double)(iVar9 + -0xf);
  dVar19 = (double)(((long)(iVar9 + -2) - (long)(iVar9 + -0xf)) + 1);
  dVar20 = (double)(int)(((uVar14 | 0xd) - uVar14) + 1);
  local_58 = (undefined1  [8])QVar18;
  puStack_50 = (undefined1 *)dVar17;
  local_48 = (undefined1 *)dVar19;
  local_40 = dVar20;
  QPainterPath::arcTo((QRectF *)local_68,90.0,-90.0);
  local_58 = (undefined1  [8])(double)(iVar9 + -1);
  puStack_50 = (undefined1 *)(double)(iVar13 + -7);
  QPainterPath::lineTo((QPointF *)local_68);
  dVar21 = (double)(iVar13 + -0xe);
  dVar22 = (double)(((long)(iVar13 + -1) - (long)(iVar13 + -0xe)) + 1);
  local_58 = (undefined1  [8])QVar18;
  puStack_50 = (undefined1 *)dVar21;
  local_48 = (undefined1 *)dVar19;
  local_40 = dVar22;
  QPainterPath::arcTo((QRectF *)local_68,0.0,-90.0);
  dVar19 = (double)iVar13;
  if ((iVar10 < iVar15) || (iVar8 < iVar1)) {
    if (iVar10 < iVar15 || iVar1 <= iVar8) goto LAB_003899a4;
    if (showArrow) {
      local_58._0_4_ = 0;
      local_58._4_4_ = 0x40420000;
      puStack_50 = (undefined1 *)dVar19;
      QPainterPath::lineTo((QPointF *)local_68);
      puStack_50 = (undefined1 *)(double)(iVar13 + 0x12);
      local_58._0_4_ = 0;
      local_58._4_4_ = 0x40320000;
      QPainterPath::lineTo((QPointF *)local_68);
      local_58._0_4_ = 0;
      local_58._4_4_ = 0x40320000;
      puStack_50 = (undefined1 *)dVar19;
      QPainterPath::lineTo((QPointF *)local_68);
    }
    iVar9 = (pos->yp).m_i;
    iVar1 = (pos->xp).m_i + -0x12;
    local_58._0_4_ = iVar16 + 2;
    if (iVar16 + 2 < iVar1) {
      local_58._0_4_ = iVar1;
    }
  }
  else {
    if (showArrow) {
      local_58 = (undefined1  [8])(double)(iVar9 + -0x13);
      puStack_50 = (undefined1 *)dVar19;
      QPainterPath::lineTo((QPointF *)local_68);
      local_58 = (undefined1  [8])(double)(iVar9 + -0x13);
      puStack_50 = (undefined1 *)(double)(iVar13 + 0x12);
      QPainterPath::lineTo((QPointF *)local_68);
      local_58 = (undefined1  [8])(double)(iVar9 + -0x25);
      puStack_50 = (undefined1 *)dVar19;
      QPainterPath::lineTo((QPointF *)local_68);
    }
    iVar9 = (pos->yp).m_i;
    iVar1 = ((pos->xp).m_i - iVar11) + 0x12;
    local_58._0_4_ = (iVar12 - iVar11) + -2;
    if (iVar1 < (int)local_58._0_4_) {
      local_58._0_4_ = iVar1;
    }
  }
  local_d0 = (int)((ulong)uVar4 >> 0x20);
  local_58._4_4_ = iVar9 - local_d0;
  QWidget::move(&this->super_QWidget,(QPoint *)local_58);
LAB_003899a4:
  local_58._0_4_ = 0;
  local_58._4_4_ = 0x401c0000;
  puStack_50 = (undefined1 *)dVar19;
  QPainterPath::lineTo((QPointF *)local_68);
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  local_48 = (undefined1 *)0x402c000000000000;
  puStack_50 = (undefined1 *)dVar21;
  local_40 = dVar22;
  QPainterPath::arcTo((QRectF *)local_68,-90.0,-90.0);
  puStack_50 = (undefined1 *)(double)(uVar14 + 7);
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  QPainterPath::lineTo((QPointF *)local_68);
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  local_48 = (undefined1 *)0x402c000000000000;
  puStack_50 = (undefined1 *)dVar17;
  local_40 = dVar20;
  QPainterPath::arcTo((QRectF *)local_68,180.0,-90.0);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (undefined1  [8])(**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  QBitmap::QBitmap((QBitmap *)local_88,(QSize *)local_58);
  QColor::QColor((QColor *)local_58,color0);
  QPixmap::fill((QColor *)local_88);
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_90,(QPaintDevice *)local_88);
  QBrush::QBrush((QBrush *)local_a8,color1,SolidPattern);
  QPen::QPen((QPen *)local_58,(QBrush *)local_a8,1.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)&local_90);
  QPen::~QPen((QPen *)local_58);
  QBrush::~QBrush((QBrush *)local_a8);
  QBrush::QBrush((QBrush *)local_58,color1,SolidPattern);
  QPainter::setBrush((QBrush *)&local_90);
  QBrush::~QBrush((QBrush *)local_58);
  QPainter::drawPath((QPainterPath *)&local_90);
  QWidget::setMask(&this->super_QWidget,(QBitmap *)local_88);
  QPixmap::QPixmap((QPixmap *)local_a8,(QSize *)(local_68 + 8));
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
  uVar4 = local_98;
  local_58 = (undefined1  [8])QDataStream::operator<<;
  local_98 = 0;
  local_48 = *(undefined1 **)&this->field_0x40;
  *(undefined8 *)&this->field_0x40 = uVar4;
  QPixmap::~QPixmap((QPixmap *)local_58);
  QPixmap::~QPixmap((QPixmap *)local_a8);
  local_a8[0] = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)local_a8,(QPaintDevice *)&this->pixmap);
  pQVar5 = QWidget::palette(&this->super_QWidget);
  puVar6 = (undefined8 *)QPalette::brush((ColorGroup)pQVar5,Dark);
  auVar23 = QColor::darker((int)*puVar6 + 8);
  local_58 = auVar23._0_8_;
  puStack_50._0_6_ = auVar23._8_6_;
  QBrush::QBrush(local_b8,(QColor *)local_58,SolidPattern);
  QPen::QPen(local_b0,local_b8,1.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)local_a8);
  QPen::~QPen(local_b0);
  QBrush::~QBrush(local_b8);
  pQVar5 = QWidget::palette(&this->super_QWidget);
  plVar7 = (long *)QPalette::brush((ColorGroup)pQVar5,Dark);
  QVar24._8_8_ = *(undefined8 *)(*plVar7 + 8);
  QVar24._0_8_ = (QPainter *)local_a8;
  QPainter::setBrush(QVar24);
  QPainter::drawPath((QPainterPath *)local_a8);
  if (0 < msecs) {
    QBasicTimer::start(&this->timer,(ulong)(uint)msecs * 1000000,1,this);
  }
  QWidget::show(&this->super_QWidget);
  QPainter::~QPainter((QPainter *)local_a8);
  QPainter::~QPainter((QPainter *)&local_90);
  QBitmap::~QBitmap((QBitmap *)local_88);
  QPainterPath::~QPainterPath((QPainterPath *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBalloonTip::balloon(const QPoint& pos, int msecs, bool showArrow)
{
    this->showArrow = showArrow;
    QScreen *screen = QGuiApplication::screenAt(pos);
    if (!screen)
        screen = QGuiApplication::primaryScreen();
    QRect screenRect = screen->geometry();
    QSize sh = sizeHint();
    const int border = 1;
    const int ah = 18, ao = 18, aw = 18, rc = 7;
    bool arrowAtTop = (pos.y() + sh.height() + ah < screenRect.height());
    bool arrowAtLeft = (pos.x() + sh.width() - ao < screenRect.width());
    setContentsMargins(border + 3,  border + (arrowAtTop ? ah : 0) + 2, border + 3, border + (arrowAtTop ? 0 : ah) + 2);
    updateGeometry();
    sh  = sizeHint();

    int ml, mr, mt, mb;
    QSize sz = sizeHint();
    if (!arrowAtTop) {
        ml = mt = 0;
        mr = sz.width() - 1;
        mb = sz.height() - ah - 1;
    } else {
        ml = 0;
        mt = ah;
        mr = sz.width() - 1;
        mb = sz.height() - 1;
    }

    QPainterPath path;
    path.moveTo(ml + rc, mt);
    if (arrowAtTop && arrowAtLeft) {
        if (showArrow) {
            path.lineTo(ml + ao, mt);
            path.lineTo(ml + ao, mt - ah);
            path.lineTo(ml + ao + aw, mt);
        }
        move(qMax(pos.x() - ao, screenRect.left() + 2), pos.y());
    } else if (arrowAtTop && !arrowAtLeft) {
        if (showArrow) {
            path.lineTo(mr - ao - aw, mt);
            path.lineTo(mr - ao, mt - ah);
            path.lineTo(mr - ao, mt);
        }
        move(qMin(pos.x() - sh.width() + ao, screenRect.right() - sh.width() - 2), pos.y());
    }
    path.lineTo(mr - rc, mt);
    path.arcTo(QRect(mr - rc*2, mt, rc*2, rc*2), 90, -90);
    path.lineTo(mr, mb - rc);
    path.arcTo(QRect(mr - rc*2, mb - rc*2, rc*2, rc*2), 0, -90);
    if (!arrowAtTop && !arrowAtLeft) {
        if (showArrow) {
            path.lineTo(mr - ao, mb);
            path.lineTo(mr - ao, mb + ah);
            path.lineTo(mr - ao - aw, mb);
        }
        move(qMin(pos.x() - sh.width() + ao, screenRect.right() - sh.width() - 2),
             pos.y() - sh.height());
    } else if (!arrowAtTop && arrowAtLeft) {
        if (showArrow) {
            path.lineTo(ao + aw, mb);
            path.lineTo(ao, mb + ah);
            path.lineTo(ao, mb);
        }
        move(qMax(pos.x() - ao, screenRect.x() + 2), pos.y() - sh.height());
    }
    path.lineTo(ml + rc, mb);
    path.arcTo(QRect(ml, mb - rc*2, rc*2, rc*2), -90, -90);
    path.lineTo(ml, mt + rc);
    path.arcTo(QRect(ml, mt, rc*2, rc*2), 180, -90);

    // Set the mask
    QBitmap bitmap = QBitmap(sizeHint());
    bitmap.fill(Qt::color0);
    QPainter painter1(&bitmap);
    painter1.setPen(QPen(Qt::color1, border));
    painter1.setBrush(QBrush(Qt::color1));
    painter1.drawPath(path);
    setMask(bitmap);

    // Draw the border
    pixmap = QPixmap(sz);
    QPainter painter2(&pixmap);
    painter2.setPen(QPen(palette().color(QPalette::Window).darker(160), border));
    painter2.setBrush(palette().color(QPalette::Window));
    painter2.drawPath(path);

    if (msecs > 0)
        timer.start(msecs * 1ms, this);
    show();
}